

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveAllCursors(BtShared *pBt,Pgno iRoot,BtCursor *pExcept)

{
  BtCursor *local_30;
  BtCursor *p;
  BtCursor *pExcept_local;
  Pgno iRoot_local;
  BtShared *pBt_local;
  
  for (local_30 = pBt->pCursor;
      (local_30 != (BtCursor *)0x0 &&
      ((local_30 == pExcept || ((iRoot != 0 && (local_30->pgnoRoot != iRoot))))));
      local_30 = local_30->pNext) {
  }
  if (local_30 == (BtCursor *)0x0) {
    if (pExcept != (BtCursor *)0x0) {
      pExcept->curFlags = pExcept->curFlags & 0xdf;
    }
    pBt_local._4_4_ = 0;
  }
  else {
    pBt_local._4_4_ = saveCursorsOnList(local_30,iRoot,pExcept);
  }
  return pBt_local._4_4_;
}

Assistant:

static int saveAllCursors(BtShared *pBt, Pgno iRoot, BtCursor *pExcept){
  BtCursor *p;
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pExcept==0 || pExcept->pBt==pBt );
  for(p=pBt->pCursor; p; p=p->pNext){
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ) break;
  }
  if( p ) return saveCursorsOnList(p, iRoot, pExcept);
  if( pExcept ) pExcept->curFlags &= ~BTCF_Multiple;
  return SQLITE_OK;
}